

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariantSet
          (AsciiParser *this,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          *variantSetOut)

{
  bool bVar1;
  ostream *poVar2;
  size_t offset;
  Specifier s;
  string local_d50;
  ostringstream local_d30 [8];
  ostringstream ss_e_6;
  string local_bb8;
  string local_b98;
  allocator local_b71;
  string local_b70 [32];
  fmt local_b50 [32];
  ostringstream local_b30 [8];
  ostringstream ss_e_5;
  long local_9b8;
  int64_t idx;
  undefined1 local_9a8 [4];
  Specifier child_spec;
  ostringstream local_988 [8];
  ostringstream ss_e_4;
  string local_810;
  ostringstream local_7f0 [8];
  ostringstream ss_e_3;
  undefined1 local_678 [8];
  Identifier tok;
  undefined1 local_650 [7];
  char c_1;
  VariantContent variantContent;
  ostringstream local_570 [8];
  ostringstream ss_e_2;
  char local_3f1;
  undefined1 local_3f0 [7];
  char mc;
  PrimMetaMap metas;
  ostringstream local_3a0 [8];
  ostringstream ss_e_1;
  undefined1 local_228 [8];
  string variantName;
  undefined1 local_200 [7];
  char c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  variantContentMap;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  *variantSetOut_local;
  uint32_t depth_local;
  int64_t parentPrimIdx_local;
  int64_t primIdx_local;
  AsciiParser *this_local;
  
  if (variantSetOut ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
       *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[ASCII]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x120d);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[InternalError] variantSetOut arg is nullptr.")
    ;
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&variantContentMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::__cxx11::string::~string
              ((string *)&variantContentMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    bVar1 = Expect(this,'{');
    if (bVar1) {
      bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (bVar1) {
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
               *)local_200);
        do {
          bVar1 = Eof(this);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0056e130:
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
            ::operator=(variantSetOut,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                         *)local_200);
            this_local._7_1_ = 1;
            variantName.field_2._8_4_ = 1;
            break;
          }
          bVar1 = Char1(this,variantName.field_2._M_local_buf + 0xf);
          if (!bVar1) {
            this_local._7_1_ = 0;
            variantName.field_2._8_4_ = 1;
            break;
          }
          if (variantName.field_2._M_local_buf[0xf] == '}') goto LAB_0056e130;
          Rewind(this,1);
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            variantName.field_2._8_4_ = 1;
            break;
          }
          ::std::__cxx11::string::string((string *)local_228);
          bVar1 = ReadBasicType(this,(string *)local_228);
          if (bVar1) {
            bVar1 = SkipWhitespace(this);
            if (bVar1) {
              ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                     *)local_3f0);
              bVar1 = LookChar1(this,&local_3f1);
              if (bVar1) {
                if ((local_3f1 != '(') ||
                   (bVar1 = ParsePrimMetas(this,(PrimMetaMap *)local_3f0), bVar1)) {
                  bVar1 = Expect(this,'{');
                  if (bVar1) {
                    bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
                    if (bVar1) {
                      VariantContent::VariantContent((VariantContent *)local_650);
                      do {
                        bVar1 = Eof(this);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0056e092:
                          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
                          if (bVar1) {
                            ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                            ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                                         *)local_650,
                                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                                         *)local_3f0);
                            ::std::
                            map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
                            ::
                            emplace<std::__cxx11::string&,tinyusdz::ascii::AsciiParser::VariantContent&>
                                      ((map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
                                        *)local_200,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_228,(VariantContent *)local_650);
                            variantName.field_2._8_4_ = 0;
                          }
                          else {
                            this_local._7_1_ = 0;
                            variantName.field_2._8_4_ = 1;
                          }
                          break;
                        }
                        bVar1 = Char1(this,tok.super_string.field_2._M_local_buf + 0xf);
                        if (!bVar1) {
                          this_local._7_1_ = 0;
                          variantName.field_2._8_4_ = 1;
                          break;
                        }
                        if (tok.super_string.field_2._M_local_buf[0xf] == '}') goto LAB_0056e092;
                        bVar1 = Rewind(this,1);
                        if (!bVar1) {
                          this_local._7_1_ = 0;
                          variantName.field_2._8_4_ = 1;
                          break;
                        }
                        Identifier::Identifier((Identifier *)local_678);
                        bVar1 = ReadBasicType(this,(Identifier *)local_678);
                        if (bVar1) {
                          offset = ::std::__cxx11::string::size();
                          bVar1 = Rewind(this,offset);
                          if (bVar1) {
                            bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_678,"variantSet");
                            if (bVar1) {
                              ::std::__cxx11::ostringstream::ostringstream(local_988);
                              poVar2 = ::std::operator<<((ostream *)local_988,"[error]");
                              poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                              poVar2 = ::std::operator<<(poVar2,":");
                              poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
                              poVar2 = ::std::operator<<(poVar2,"():");
                              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1277);
                              ::std::operator<<(poVar2," ");
                              poVar2 = ::std::operator<<((ostream *)local_988,
                                                         "Nested `variantSet` is not supported yet."
                                                        );
                              ::std::operator<<(poVar2,"\n");
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,(string *)local_9a8);
                              ::std::__cxx11::string::~string((string *)local_9a8);
                              this_local._7_1_ = 0;
                              variantName.field_2._8_4_ = 1;
                              ::std::__cxx11::ostringstream::~ostringstream(local_988);
                            }
                            else {
                              idx._4_4_ = Invalid;
                              bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_678,"def");
                              if (bVar1) {
                                idx._4_4_ = Def;
                              }
                              else {
                                bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_678,"over");
                                if (bVar1) {
                                  idx._4_4_ = Over;
                                }
                                else {
                                  bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_678,"class");
                                  if (bVar1) {
                                    idx._4_4_ = Class;
                                  }
                                }
                              }
                              if (idx._4_4_ == Invalid) {
                                bVar1 = ParsePrimProps(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)&variantContent.primIndices.
                                                     super__Vector_base<long,_std::allocator<long>_>
                                                     ._M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage,
                                                  (
                                                  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  *)&variantContent.props._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count);
                                if (bVar1) goto LAB_0056e046;
                                ::std::__cxx11::ostringstream::ostringstream(local_d30);
                                poVar2 = ::std::operator<<((ostream *)local_d30,"[error]");
                                poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                poVar2 = ::std::operator<<(poVar2,":");
                                poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
                                poVar2 = ::std::operator<<(poVar2,"():");
                                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x129b);
                                ::std::operator<<(poVar2," ");
                                poVar2 = ::std::operator<<((ostream *)local_d30,
                                                           "Failed to parse Prim attribute.");
                                ::std::operator<<(poVar2,"\n");
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,&local_d50);
                                ::std::__cxx11::string::~string((string *)&local_d50);
                                this_local._7_1_ = 0;
                                variantName.field_2._8_4_ = 1;
                                ::std::__cxx11::ostringstream::~ostringstream(local_d30);
                              }
                              else {
                                local_9b8 = ::std::function<long_(long)>::operator()
                                                      (&this->_prim_idx_assign_fun,parentPrimIdx);
                                bVar1 = ParseBlock(this,idx._4_4_,local_9b8,primIdx,depth + 1,true);
                                if (bVar1) {
                                  ::std::vector<long,_std::allocator<long>_>::push_back
                                            ((vector<long,_std::allocator<long>_> *)
                                             &variantContent.metas._M_t._M_impl.
                                              super__Rb_tree_header._M_node_count,&local_9b8);
LAB_0056e046:
                                  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
                                  if (bVar1) {
                                    variantName.field_2._8_4_ = 0;
                                  }
                                  else {
                                    this_local._7_1_ = 0;
                                    variantName.field_2._8_4_ = 1;
                                  }
                                }
                                else {
                                  ::std::__cxx11::ostringstream::ostringstream(local_b30);
                                  poVar2 = ::std::operator<<((ostream *)local_b30,"[error]");
                                  poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                  poVar2 = ::std::operator<<(poVar2,":");
                                  poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
                                  poVar2 = ::std::operator<<(poVar2,"():");
                                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1290);
                                  ::std::operator<<(poVar2," ");
                                  ::std::allocator<char>::allocator();
                                  ::std::__cxx11::string::string
                                            (local_b70,"`{}` block parse failed.",&local_b71);
                                  tinyusdz::to_string_abi_cxx11_
                                            (&local_b98,(tinyusdz *)(ulong)idx._4_4_,s);
                                  fmt::format<std::__cxx11::string>
                                            (local_b50,(string *)local_b70,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_b98);
                                  poVar2 = ::std::operator<<((ostream *)local_b30,
                                                             (string *)local_b50);
                                  ::std::operator<<(poVar2,"\n");
                                  ::std::__cxx11::string::~string((string *)local_b50);
                                  ::std::__cxx11::string::~string((string *)&local_b98);
                                  ::std::__cxx11::string::~string(local_b70);
                                  ::std::allocator<char>::~allocator((allocator<char> *)&local_b71);
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,&local_bb8);
                                  ::std::__cxx11::string::~string((string *)&local_bb8);
                                  this_local._7_1_ = 0;
                                  variantName.field_2._8_4_ = 1;
                                  ::std::__cxx11::ostringstream::~ostringstream(local_b30);
                                }
                              }
                            }
                          }
                          else {
                            this_local._7_1_ = 0;
                            variantName.field_2._8_4_ = 1;
                          }
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_7f0);
                          poVar2 = ::std::operator<<((ostream *)local_7f0,"[error]");
                          poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                          poVar2 = ::std::operator<<(poVar2,":");
                          poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
                          poVar2 = ::std::operator<<(poVar2,"():");
                          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x126f);
                          ::std::operator<<(poVar2," ");
                          poVar2 = ::std::operator<<((ostream *)local_7f0,
                                                                                                          
                                                  "Failed to parse an identifier in variantSet block statement."
                                                  );
                          ::std::operator<<(poVar2,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,&local_810);
                          ::std::__cxx11::string::~string((string *)&local_810);
                          this_local._7_1_ = 0;
                          variantName.field_2._8_4_ = 1;
                          ::std::__cxx11::ostringstream::~ostringstream(local_7f0);
                        }
                        Identifier::~Identifier((Identifier *)local_678);
                      } while (variantName.field_2._8_4_ == 0);
                      VariantContent::~VariantContent((VariantContent *)local_650);
                    }
                    else {
                      this_local._7_1_ = 0;
                      variantName.field_2._8_4_ = 1;
                    }
                  }
                  else {
                    this_local._7_1_ = 0;
                    variantName.field_2._8_4_ = 1;
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_570);
                  poVar2 = ::std::operator<<((ostream *)local_570,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,"[ASCII]");
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x124a);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)local_570,
                                             "Failed to parse PrimSpec metas in variant statement.")
                  ;
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)
                                 &variantContent.variantSets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &variantContent.variantSets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
                  this_local._7_1_ = 0;
                  variantName.field_2._8_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_570);
                }
              }
              else {
                this_local._7_1_ = 0;
                variantName.field_2._8_4_ = 1;
              }
              ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                      *)local_3f0);
            }
            else {
              this_local._7_1_ = 0;
              variantName.field_2._8_4_ = 1;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_3a0);
            poVar2 = ::std::operator<<((ostream *)local_3a0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[ASCII]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1238);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_3a0,
                                       "Failed to parse variant name for `variantSet` statement.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&metas._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ::std::__cxx11::string::~string
                      ((string *)&metas._M_t._M_impl.super__Rb_tree_header._M_node_count);
            this_local._7_1_ = 0;
            variantName.field_2._8_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_3a0);
          }
          ::std::__cxx11::string::~string((string *)local_228);
        } while (variantName.field_2._8_4_ == 0);
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                *)local_200);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseVariantSet(
    const int64_t primIdx, const int64_t parentPrimIdx, const uint32_t depth,
    std::map<std::string, VariantContent> *variantSetOut) {
  if (!variantSetOut) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii,
                              "[InternalError] variantSetOut arg is nullptr.");
  }

  // variantSet =
  // {
  //   "variantName0" ( metas ) { ... }
  //   "variantName1" ( metas ) { ... }
  //   ...
  // }
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, VariantContent> variantContentMap;

  // for each variantStatement
  while (!Eof()) {
    {
      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '}') {
        // end
        break;
      }

      Rewind(1);
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // string
    std::string variantName;
    if (!ReadBasicType(&variantName)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Failed to parse variant name for `variantSet` statement.");
    }

    if (!SkipWhitespace()) {
      return false;
    }

    // Optional: PrimSpec meta
    PrimMetaMap metas;
    {
      char mc;
      if (!LookChar1(&mc)) {
        return false;
      }

      if (mc == '(') {
        if (!ParsePrimMetas(&metas)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii, "Failed to parse PrimSpec metas in variant statement.");
        }
      }
    }

    if (!Expect('{')) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    VariantContent variantContent;

    while (!Eof()) {
      {
        char c;
        if (!Char1(&c)) {
          return false;
        }

        if (c == '}') {
          DCOUT("End block in variantSet stmt.");
          // end block
          break;
        }
      }

      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read first token in VariantSet stmt");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in variantSet block statement.");
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      if (tok == "variantSet") {
        PUSH_ERROR_AND_RETURN("Nested `variantSet` is not supported yet.");
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      // No specifier => Assume properties only.
      // Has specifier => Prim
      if (child_spec != Specifier::Invalid) {
        // FIXME: Assign idx dedicated for variant.
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseBlock in variantSet. spec = "
              << to_string(child_spec) << ", idx = " << idx
              << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1,
                        /* in_variantStmt */ true)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));

        DCOUT(fmt::format("Add primIdx {} to variant {}", idx, variantName));
        variantContent.primIndices.push_back(idx);

      } else {
        DCOUT("Enter ParsePrimProps.");
        if (!ParsePrimProps(&variantContent.props,
                            &variantContent.properties)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
        DCOUT(fmt::format("Done parse ParsePrimProps."));
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    DCOUT(fmt::format("variantSet item {} parsed.", variantName));

    variantContent.metas = metas;
    variantContentMap.emplace(variantName, variantContent);
  }

  (*variantSetOut) = std::move(variantContentMap);

  return true;
}